

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Success::~Success(Success *this)

{
  void *in_RDI;
  
  ~Success((Success *)0x174a88);
  operator_delete(in_RDI);
  return;
}

Assistant:

Success() : Success("Successfully completed, should be caught and quit", ExitCodes::Success) {}